

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_cellular_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,int tile_size,rf_rand_proc rand,
          rf_color *dst,rf_int dst_size)

{
  double dVar1;
  int seeds_per_row_00;
  int iVar2;
  int iVar3;
  rf_vec2 rVar4;
  double dVar5;
  double dVar6;
  undefined4 uStack_84;
  rf_color local_7c;
  int local_78;
  int intensity;
  float dist;
  rf_vec2 neighbor_seed;
  rf_int j;
  rf_int i;
  float min_distance;
  int tile_x;
  rf_int x;
  long lStack_40;
  int tile_y;
  rf_int y;
  int seeds_count;
  int seeds_per_col;
  int seeds_per_row;
  rf_color *dst_local;
  rf_rand_proc rand_local;
  int tile_size_local;
  int height_local;
  int width_local;
  
  memset(__return_storage_ptr__,0,0x18);
  seeds_per_row_00 = width / tile_size;
  iVar2 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
  if (width * height * iVar2 <= dst_size) {
    for (lStack_40 = 0; lStack_40 < height; lStack_40 = lStack_40 + 1) {
      iVar2 = (int)(lStack_40 / (long)tile_size);
      for (_min_distance = 0; _min_distance < width; _min_distance = _min_distance + 1) {
        iVar3 = (int)(_min_distance / (long)tile_size);
        i._0_4_ = INFINITY;
        for (j = -1; j < 2; j = j + 1) {
          if ((-1 < iVar3 + j) && (iVar3 + j < (long)seeds_per_row_00)) {
            neighbor_seed.x = -NAN;
            neighbor_seed.y = -NAN;
            for (; (long)neighbor_seed < 2; neighbor_seed = (rf_vec2)((long)neighbor_seed + 1)) {
              if ((-1 < (long)iVar2 + (long)neighbor_seed) &&
                 ((long)iVar2 + (long)neighbor_seed < (long)(height / tile_size))) {
                rVar4 = rf_get_seed_for_cellular_image
                                  (seeds_per_row_00,tile_size,
                                   (iVar2 + (int)neighbor_seed.x) * seeds_per_row_00 + iVar3 +
                                   (int)j,rand);
                intensity = (int)rVar4.x;
                dist = rVar4.y;
                dVar5 = hypot((double)(_min_distance - (int)(float)intensity),
                              (double)(lStack_40 - (int)dist));
                dVar6 = (double)(float)i;
                dVar5 = (double)(float)dVar5;
                dVar1 = dVar5;
                if (dVar6 <= dVar5) {
                  dVar1 = dVar6;
                }
                i._0_4_ = (float)(double)(~-(ulong)NAN(dVar6) & (ulong)dVar1 |
                                         -(ulong)NAN(dVar6) & (ulong)dVar5);
              }
            }
          }
        }
        local_78 = (int)(((float)i * 256.0) / (float)tile_size);
        if (0xff < local_78) {
          local_78 = 0xff;
        }
        local_7c.g = (uchar)local_78;
        local_7c.r = local_7c.g;
        local_7c.b = local_7c.g;
        local_7c.a = 0xff;
        dst[lStack_40 * width + _min_distance] = local_7c;
      }
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = 7;
    __return_storage_ptr__->valid = true;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uStack_84._1_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_cellular_to_buffer(int width, int height, int tile_size, rf_rand_proc rand, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    int seeds_per_row = width / tile_size;
    int seeds_per_col = height / tile_size;
    int seeds_count = seeds_per_row * seeds_per_col;

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int y = 0; y < height; y++)
        {
            int tile_y = y / tile_size;

            for (rf_int x = 0; x < width; x++)
            {
                int tile_x = x / tile_size;

                float min_distance = INFINITY;

                // Check all adjacent tiles
                for (rf_int i = -1; i < 2; i++)
                {
                    if ((tile_x + i < 0) || (tile_x + i >= seeds_per_row)) continue;

                    for (rf_int j = -1; j < 2; j++)
                    {
                        if ((tile_y + j < 0) || (tile_y + j >= seeds_per_col)) continue;

                        rf_vec2 neighbor_seed = rf_get_seed_for_cellular_image(seeds_per_row, tile_size, (tile_y + j) * seeds_per_row + tile_x + i, rand);

                        float dist = (float)hypot(x - (int)neighbor_seed.x, y - (int)neighbor_seed.y);
                        min_distance = (float)fmin(min_distance, dist);
                    }
                }

                // I made this up but it seems to give good results at all tile sizes
                int intensity = (int)(min_distance * 256.0f / tile_size);
                if (intensity > 255) intensity = 255;

                dst[y * width + x] = (rf_color) { intensity, intensity, intensity, 255 };
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}